

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t zeRTASBuilderDestroyExt(ze_rtas_builder_ext_handle_t hBuilder)

{
  ze_pfnRTASBuilderDestroyExt_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnRTASBuilderDestroyExt_t pfnDestroyExt;
  ze_rtas_builder_ext_handle_t hBuilder_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->RTASBuilder).pfnDestroyExt;
    if (p_Var1 == (ze_pfnRTASBuilderDestroyExt_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hBuilder_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hBuilder_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hBuilder_local._4_4_ = (*p_Var1)(hBuilder);
    }
  }
  else {
    hBuilder_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hBuilder_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeRTASBuilderDestroyExt(
    ze_rtas_builder_ext_handle_t hBuilder           ///< [in][release] handle of builder object to destroy
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnRTASBuilderDestroyExt_t pfnDestroyExt = [&result] {
        auto pfnDestroyExt = ze_lib::context->zeDdiTable.load()->RTASBuilder.pfnDestroyExt;
        if( nullptr == pfnDestroyExt ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnDestroyExt;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnDestroyExt( hBuilder );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnDestroyExt = ze_lib::context->zeDdiTable.load()->RTASBuilder.pfnDestroyExt;
    if( nullptr == pfnDestroyExt ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnDestroyExt( hBuilder );
    #endif
}